

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O1

void printInt64Bang(SStream *O,int64_t val)

{
  char *fmt;
  
  if (val < 0) {
    if (val < -9) {
      fmt = "#-0x%lx";
      val = -val;
    }
    else {
      fmt = "#-%lu";
      val = -val;
    }
  }
  else if (val < 10) {
    fmt = "#%lu";
  }
  else {
    fmt = "#0x%lx";
  }
  SStream_concat(O,fmt,val);
  return;
}

Assistant:

void printInt64Bang(SStream *O, int64_t val)
{
	if (val >= 0) {
		if (val > HEX_THRESHOLD)
			SStream_concat(O, "#0x%"PRIx64, val);
		else
			SStream_concat(O, "#%"PRIu64, val);
	} else {
		if (val <- HEX_THRESHOLD)
			SStream_concat(O, "#-0x%"PRIx64, -val);
		else
			SStream_concat(O, "#-%"PRIu64, -val);
	}
}